

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.h
# Opt level: O0

void bandit::use_default_colorizers(choice_options *choices)

{
  choice_options *pcVar1;
  anon_class_1_0_00000001 local_109;
  controller_func_t local_108;
  allocator local_e1;
  string local_e0;
  anon_class_1_0_00000001 local_b9;
  controller_func_t local_b8;
  allocator local_91;
  string local_90;
  anon_class_1_0_00000001 local_69;
  controller_func_t local_68;
  allocator local_31;
  string local_30;
  choice_options *local_10;
  choice_options *choices_local;
  
  local_10 = choices;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,"off",&local_31);
  std::function<void(bandit::detail::controller_t&)>::
  function<bandit::use_default_colorizers(bandit::detail::choice_options&)::_lambda(bandit::detail::controller_t&)_1_,void>
            ((function<void(bandit::detail::controller_t&)> *)&local_68,&local_69);
  detail::option_map::add(&choices->colorizers,&local_30,&local_68,false);
  std::function<void_(bandit::detail::controller_t_&)>::~function(&local_68);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_90,"dark",&local_91);
  std::function<void(bandit::detail::controller_t&)>::
  function<bandit::use_default_colorizers(bandit::detail::choice_options&)::_lambda(bandit::detail::controller_t&)_2_,void>
            ((function<void(bandit::detail::controller_t&)> *)&local_b8,&local_b9);
  detail::option_map::add(&pcVar1->colorizers,&local_90,&local_b8,false);
  std::function<void_(bandit::detail::controller_t_&)>::~function(&local_b8);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  pcVar1 = local_10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_e0,"light",&local_e1);
  std::function<void(bandit::detail::controller_t&)>::
  function<bandit::use_default_colorizers(bandit::detail::choice_options&)::_lambda(bandit::detail::controller_t&)_3_,void>
            ((function<void(bandit::detail::controller_t&)> *)&local_108,&local_109);
  detail::option_map::add(&pcVar1->colorizers,&local_e0,&local_108,true);
  std::function<void_(bandit::detail::controller_t_&)>::~function(&local_108);
  std::__cxx11::string::~string((string *)&local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  return;
}

Assistant:

inline void use_default_colorizers(detail::choice_options& choices) {
    choices.colorizers.add("off", [&](detail::controller_t& controller) {
      controller.set_colorizer(new colorizer::off());
    });
    choices.colorizers.add("dark", [&](detail::controller_t& controller) {
      controller.set_colorizer(new colorizer::dark());
    });
    choices.colorizers.add("light", [&](detail::controller_t& controller) {
      controller.set_colorizer(new colorizer::light());
    }, true);
  }